

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O3

void cjson_add_string_should_fail_with_null_pointers(void)

{
  cJSON *object;
  cJSON *pcVar1;
  
  object = (cJSON *)(*global_hooks.allocate)(0x40);
  if (object != (cJSON *)0x0) {
    object->child = (cJSON *)0x0;
    *(undefined8 *)&object->type = 0;
    object->valuedouble = 0.0;
    object->string = (char *)0x0;
    object->valuestring = (char *)0x0;
    *(undefined8 *)&object->valueint = 0;
    object->next = (cJSON *)0x0;
    object->prev = (cJSON *)0x0;
    object->type = 0x40;
  }
  pcVar1 = cJSON_AddStringToObject((cJSON *)0x0,"string","string");
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",299);
  }
  pcVar1 = cJSON_AddStringToObject(object,(char *)0x0,"string");
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",300);
  }
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_string_should_fail_with_null_pointers(void)
{
    cJSON *root = cJSON_CreateObject();

    TEST_ASSERT_NULL(cJSON_AddStringToObject(NULL, "string", "string"));
    TEST_ASSERT_NULL(cJSON_AddStringToObject(root, NULL, "string"));

    cJSON_Delete(root);
}